

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordSet.cpp
# Opt level: O0

void __thiscall KDIS::DATA_TYPE::RecordSet::Decode(RecordSet *this,KDataStream *stream)

{
  KUINT16 KVar1;
  KException *this_00;
  KDataStream *pKVar2;
  byte local_50;
  uchar local_4f;
  byte local_4e;
  undefined1 local_4d;
  KUINT8 i;
  KUINT8 ui8Val;
  KUINT8 ui8LenOfRecVal;
  allocator<char> local_39;
  KString local_38;
  KDataStream *local_18;
  KDataStream *stream_local;
  RecordSet *this_local;
  
  local_18 = stream;
  stream_local = (KDataStream *)this;
  KVar1 = KDataStream::GetBufferSize(stream);
  if (KVar1 < 0xc) {
    local_4d = 1;
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"Decode",&local_39);
    KException::KException(this_00,&local_38,2);
    local_4d = 0;
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->m_vui8RecVals);
  pKVar2 = KDataStream::operator>>(local_18,&this->m_ui32RecID);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui32RecSetSerialNum);
  pKVar2 = KDataStream::operator>>(pKVar2,&this->m_ui16RecLen);
  KDataStream::operator>>(pKVar2,&this->m_ui16RecCnt);
  local_4e = (char)this->m_ui16RecLen - 0xc;
  local_4f = '\0';
  for (local_50 = 0; local_50 < local_4e; local_50 = local_50 + 1) {
    KDataStream::operator>>(local_18,&local_4f);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&this->m_vui8RecVals,&local_4f);
  }
  return;
}

Assistant:

void RecordSet::Decode(KDataStream &stream) noexcept(false)
{
    if( stream.GetBufferSize() < RECORD_SET_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vui8RecVals.clear();

    stream >> m_ui32RecID
           >> m_ui32RecSetSerialNum
           >> m_ui16RecLen
           >> m_ui16RecCnt;

    KUINT8 ui8LenOfRecVal = m_ui16RecLen - RECORD_SET_SIZE;

    KUINT8 ui8Val = 0;

    // This data also includes any padding that may exist.
    for( KUINT8 i = 0; i < ui8LenOfRecVal; ++i )
    {
        stream >> ui8Val;
        m_vui8RecVals.push_back( ui8Val );
    }
}